

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int propagateConstants(Parse *pParse,Select *p)

{
  WhereConst local_78;
  Walker local_60;
  
  local_78.pParse = pParse;
  do {
    local_78.nConst = 0;
    local_78.nChng = 0;
    local_78.apExpr = (Expr **)0x0;
    findConstInWhere(&local_78,p->pWhere);
    if (local_78.nConst == 0) {
    }
    else {
      local_60.xExprCallback = propagateConstantExprRewrite;
      local_60.xSelectCallback = sqlite3SelectWalkNoop;
      local_60.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
      local_60.walkerDepth = 0;
      local_60.eCode = '\0';
      local_60._37_3_ = 0;
      local_60.pParse = pParse;
      local_60.u.pNC = (NameContext *)&local_78;
      if (p->pWhere != (Expr *)0x0) {
        local_60.u.pNC = (NameContext *)&local_78;
        walkExpr(&local_60,p->pWhere);
      }
      if (local_78.apExpr != (Expr **)0x0) {
        sqlite3DbFreeNN((local_78.pParse)->db,local_78.apExpr);
      }
    }
  } while (local_78.nChng != 0);
  return 0;
}

Assistant:

static int propagateConstants(
  Parse *pParse,   /* The parsing context */
  Select *p        /* The query in which to propagate constants */
){
  WhereConst x;
  Walker w;
  int nChng = 0;
  x.pParse = pParse;
  do{
    x.nConst = 0;
    x.nChng = 0;
    x.apExpr = 0;
    findConstInWhere(&x, p->pWhere);
    if( x.nConst ){
      memset(&w, 0, sizeof(w));
      w.pParse = pParse;
      w.xExprCallback = propagateConstantExprRewrite;
      w.xSelectCallback = sqlite3SelectWalkNoop;
      w.xSelectCallback2 = 0;
      w.walkerDepth = 0;
      w.u.pConst = &x;
      sqlite3WalkExpr(&w, p->pWhere);
      sqlite3DbFree(x.pParse->db, x.apExpr);
      nChng += x.nChng;
    }
  }while( x.nChng );  
  return nChng;
}